

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O0

void __thiscall
despot::option::PrintUsageImplementation::LineWrapper::flush(LineWrapper *this,IStringWriter *write)

{
  bool bVar1;
  int local_1c;
  IStringWriter *pIStack_18;
  int _;
  IStringWriter *write_local;
  LineWrapper *this_local;
  
  pIStack_18 = write;
  write_local = (IStringWriter *)this;
  bVar1 = buf_empty(this);
  if (!bVar1) {
    local_1c = 0;
    indent(pIStack_18,&local_1c,this->x);
    this->wrote_something = false;
    while (bVar1 = buf_empty(this), ((bVar1 ^ 0xffU) & 1) != 0) {
      write_one_line(this,pIStack_18);
    }
    (*pIStack_18->_vptr_IStringWriter[2])(pIStack_18,"\n",1);
  }
  return;
}

Assistant:

void flush(IStringWriter& write) {
			if (buf_empty())
				return;
			int _ = 0;
			indent(write, _, x);
			wrote_something = false;
			while (!buf_empty())
				write_one_line(write);
			write("\n", 1);
		}